

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::SimpleSequenceExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SimpleSequenceExprSyntax *this,size_t index)

{
  SyntaxNode *node;
  size_t index_local;
  SimpleSequenceExprSyntax *this_local;
  
  if (index == 0) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->repetition->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SimpleSequenceExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return expr.get();
        case 1: return repetition;
        default: return nullptr;
    }
}